

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O1

void ResizeCountNodePages(void)

{
  size_t __size;
  int *piVar1;
  int iVar2;
  int **ppiVar3;
  int iVar4;
  int iVar5;
  int **ppiVar6;
  int **ppiVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  
  iVar4 = maxPages;
  iVar2 = page;
  lVar12 = (long)page;
  uVar9 = page + 1;
  lVar10 = (long)maxPages;
  page = uVar9;
  ppiVar7 = lightNodePages;
  iVar5 = maxPages;
  if (uVar9 == maxPages) {
    __size = lVar10 * 8 + 0x400;
    ppiVar6 = (int **)malloc(__size);
    ppiVar7 = nodePages;
    if (ppiVar6 == (int **)0x0) {
      if (-1 < iVar2) {
        uVar11 = 0;
        do {
          if (ppiVar7[uVar11] != (int *)0x0) {
            free(ppiVar7[uVar11]);
            ppiVar7[uVar11] = (int *)0x0;
          }
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
      if (nodePages != (int **)0x0) {
        free(nodePages);
        nodePages = (int **)0x0;
      }
      ppiVar6 = lightNodePages;
      ppiVar7 = lightNodePages;
      if (-1 < iVar2) {
        uVar11 = 0;
        do {
          piVar1 = ppiVar6[uVar11];
          if (piVar1 != (int *)0x0) {
            free(piVar1);
            ppiVar6[uVar11] = (int *)0x0;
          }
          uVar11 = uVar11 + 1;
          ppiVar7 = lightNodePages;
        } while (uVar9 != uVar11);
      }
      goto joined_r0x00928666;
    }
    if (0 < iVar4) {
      lVar8 = 0;
      do {
        ppiVar6[lVar8] = ppiVar7[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar10 != lVar8);
    }
    if (nodePages != (int **)0x0) {
      free(nodePages);
    }
    nodePages = ppiVar6;
    ppiVar7 = (int **)malloc(__size);
    ppiVar3 = lightNodePages;
    if (ppiVar7 == (int **)0x0) {
      if (-1 < iVar2) {
        uVar11 = 0;
        do {
          if (ppiVar6[uVar11] != (int *)0x0) {
            free(ppiVar6[uVar11]);
            ppiVar6[uVar11] = (int *)0x0;
          }
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
      free(ppiVar6);
      ppiVar6 = lightNodePages;
      nodePages = (int **)0x0;
      ppiVar7 = lightNodePages;
      if (-1 < iVar2) {
        uVar11 = 0;
        do {
          piVar1 = ppiVar6[uVar11];
          if (piVar1 != (int *)0x0) {
            free(piVar1);
            ppiVar6[uVar11] = (int *)0x0;
          }
          uVar11 = uVar11 + 1;
          ppiVar7 = lightNodePages;
        } while (uVar9 != uVar11);
      }
      goto joined_r0x00928666;
    }
    if (0 < iVar4) {
      lVar8 = 0;
      do {
        ppiVar7[lVar8] = ppiVar3[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar10 != lVar8);
    }
    iVar5 = iVar4 + 0x80;
    if (lightNodePages != (int **)0x0) {
      free(lightNodePages);
    }
  }
  maxPages = iVar5;
  lightNodePages = ppiVar7;
  currentNodePage = (int *)malloc(0x2000);
  ppiVar6 = nodePages;
  nodePages[lVar12 + 1] = currentNodePage;
  if (currentNodePage == (int *)0x0) {
    if (-1 < iVar2) {
      uVar11 = 0;
      do {
        if (ppiVar6[uVar11] != (int *)0x0) {
          free(ppiVar6[uVar11]);
          ppiVar6[uVar11] = (int *)0x0;
        }
        uVar11 = uVar11 + 1;
      } while (uVar9 != uVar11);
    }
    if (ppiVar6 != (int **)0x0) {
      free(ppiVar6);
      nodePages = (int **)0x0;
    }
    ppiVar6 = lightNodePages;
    ppiVar7 = lightNodePages;
    if (-1 < iVar2) {
      uVar11 = 0;
      do {
        piVar1 = ppiVar6[uVar11];
        if (piVar1 != (int *)0x0) {
          free(piVar1);
          ppiVar6[uVar11] = (int *)0x0;
        }
        uVar11 = uVar11 + 1;
        ppiVar7 = lightNodePages;
      } while (uVar9 != uVar11);
    }
  }
  else {
    currentLightNodePage = (int *)malloc(0x2000);
    ppiVar7 = lightNodePages;
    lightNodePages[lVar12 + 1] = currentLightNodePage;
    if (currentLightNodePage != (int *)0x0) {
      pageIndex = 0;
      return;
    }
    currentLightNodePage = (int *)0x0;
    if (-2 < iVar2) {
      uVar11 = 0;
      do {
        if (ppiVar6[uVar11] != (int *)0x0) {
          free(ppiVar6[uVar11]);
          ppiVar6[uVar11] = (int *)0x0;
        }
        uVar11 = uVar11 + 1;
      } while (iVar2 + 2 != uVar11);
    }
    if (ppiVar6 != (int **)0x0) {
      free(ppiVar6);
      nodePages = (int **)0x0;
    }
    if (-1 < iVar2) {
      uVar11 = 0;
      do {
        if (ppiVar7[uVar11] != (int *)0x0) {
          free(ppiVar7[uVar11]);
          ppiVar7[uVar11] = (int *)0x0;
        }
        uVar11 = uVar11 + 1;
      } while (uVar9 != uVar11);
    }
  }
joined_r0x00928666:
  if (ppiVar7 != (int **)0x0) {
    free(ppiVar7);
    lightNodePages = (int **)0x0;
  }
  memOut = 1;
  return;
}

Assistant:

static void
ResizeCountNodePages(void)
{
    int i;
    int **newNodePages;

    page++;

    /* If the current page index is larger than the number of pages
     * allocated, allocate a new page array. The number of pages is incremented
     * by INITIAL_PAGES.
     */
    if (page == maxPages) {
        newNodePages = ABC_ALLOC(int *,maxPages + INITIAL_PAGES);
        if (newNodePages == NULL) {
            for (i = 0; i < page; i++) ABC_FREE(nodePages[i]);
            ABC_FREE(nodePages);
            for (i = 0; i < page; i++) ABC_FREE(lightNodePages[i]);
            ABC_FREE(lightNodePages);
            memOut = 1;
            return;
        } else {
            for (i = 0; i < maxPages; i++) {
                newNodePages[i] = nodePages[i];
            }
            ABC_FREE(nodePages);
            nodePages = newNodePages;
        }

        newNodePages = ABC_ALLOC(int *,maxPages + INITIAL_PAGES);
        if (newNodePages == NULL) {
            for (i = 0; i < page; i++) ABC_FREE(nodePages[i]);
            ABC_FREE(nodePages);
            for (i = 0; i < page; i++) ABC_FREE(lightNodePages[i]);
            ABC_FREE(lightNodePages);
            memOut = 1;
            return;
        } else {
            for (i = 0; i < maxPages; i++) {
                newNodePages[i] = lightNodePages[i];
            }
            ABC_FREE(lightNodePages);
            lightNodePages = newNodePages;
        }
        /* Increase total page count */
        maxPages += INITIAL_PAGES;
    }
    /* Allocate a new page */
    currentNodePage = nodePages[page] = ABC_ALLOC(int,pageSize);
    if (currentNodePage == NULL) {
        for (i = 0; i < page; i++) ABC_FREE(nodePages[i]);
        ABC_FREE(nodePages);
        for (i = 0; i < page; i++) ABC_FREE(lightNodePages[i]);
        ABC_FREE(lightNodePages);
        memOut = 1;
        return;
    }
    /* Allocate a new page */
    currentLightNodePage = lightNodePages[page] = ABC_ALLOC(int,pageSize);
    if (currentLightNodePage == NULL) {
        for (i = 0; i <= page; i++) ABC_FREE(nodePages[i]);
        ABC_FREE(nodePages);
        for (i = 0; i < page; i++) ABC_FREE(lightNodePages[i]);
        ABC_FREE(lightNodePages);
        memOut = 1;
        return;
    }
    /* reset page index */
    pageIndex = 0;
    return;

}